

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O0

int __thiscall anon_unknown.dwarf_f6f6::AudioState::decodeFrame(AudioState *this)

{
  bool bVar1;
  int iVar2;
  pointer pAVar3;
  pointer pAVar4;
  ostream *this_00;
  void *this_01;
  pointer this_02;
  long lVar5;
  pointer pAVar6;
  long in_RDI;
  double dVar7;
  int data_size;
  int ret;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff68;
  unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *in_stack_ffffffffffffff70;
  atomic<bool> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  PacketQueue<2097152UL> *in_stack_ffffffffffffffc8;
  double local_30;
  duration<double,std::ratio<1l,1l>> local_28 [8];
  rep local_20;
  int local_14;
  
  do {
    while( true ) {
      bVar1 = std::atomic<bool>::load
                        (in_stack_ffffffffffffff78,
                         (memory_order)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return 0;
      }
      while( true ) {
        pAVar3 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::get
                           (in_stack_ffffffffffffff70);
        pAVar4 = std::unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter>::get
                           ((unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter> *)
                            in_stack_ffffffffffffff70);
        local_14 = avcodec_receive_frame(pAVar3,pAVar4);
        if (local_14 != -0xb) break;
        std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::get
                  (in_stack_ffffffffffffff70);
        PacketQueue<2097152UL>::sendTo
                  (in_stack_ffffffffffffffc8,
                   (AVCodecContext *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      }
      if (local_14 == 0) break;
      if (local_14 == -0x20464f45) {
        return 0;
      }
      this_00 = std::operator<<((ostream *)&std::cerr,"Failed to receive frame: ");
      this_01 = (void *)std::ostream::operator<<(this_00,local_14);
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    }
    pAVar4 = std::unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter>::operator->
                       ((unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter> *)0x115b55);
  } while (pAVar4->nb_samples < 1);
  pAVar4 = std::unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter>::operator->
                     ((unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter> *)0x115b71);
  if (pAVar4->best_effort_timestamp != -0x8000000000000000) {
    dVar7 = av_q2d(*(AVRational *)(*(long *)(in_RDI + 8) + 0x18));
    pAVar4 = std::unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter>::operator->
                       ((unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter> *)0x115bb7);
    local_30 = dVar7 * (double)pAVar4->best_effort_timestamp;
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,void>(local_28,&local_30);
    local_20 = (rep)std::chrono::
                    duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,double,std::ratio<1l,1l>>
                              (in_stack_ffffffffffffff68);
    *(rep *)(in_RDI + 0xd8) = local_20;
  }
  pAVar4 = std::unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter>::operator->
                     ((unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter> *)0x115c13);
  if (*(int *)(in_RDI + 0x118) < pAVar4->nb_samples) {
    av_freep(in_RDI + 0x108);
    pAVar3 = std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                       ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                        0x115c54);
    iVar2 = pAVar3->channels;
    pAVar4 = std::unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter>::operator->
                       ((unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter> *)0x115c6f);
    av_samples_alloc(in_RDI + 0x108,0,iVar2,pAVar4->nb_samples,*(undefined4 *)(in_RDI + 0x100),0);
    pAVar4 = std::unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter>::operator->
                       ((unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter> *)0x115ca7);
    *(int *)(in_RDI + 0x118) = pAVar4->nb_samples;
  }
  this_02 = std::unique_ptr<SwrContext,_(anonymous_namespace)::SwrContextDeleter>::get
                      ((unique_ptr<SwrContext,_(anonymous_namespace)::SwrContextDeleter> *)
                       in_stack_ffffffffffffff70);
  lVar5 = in_RDI + 0x108;
  pAVar4 = std::unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter>::operator->
                     ((unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter> *)0x115ced);
  iVar2 = pAVar4->nb_samples;
  pAVar4 = std::unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter>::operator->
                     ((unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter> *)0x115d05);
  pAVar6 = std::unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter>::operator->
                     ((unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter> *)0x115d1b);
  iVar2 = swr_convert(this_02,lVar5,iVar2,pAVar4,pAVar6->nb_samples);
  pAVar4 = std::unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter>::get
                     ((unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter> *)this_02);
  av_frame_unref(pAVar4);
  return iVar2;
}

Assistant:

int AudioState::decodeFrame()
{
    while(!mMovie.mQuit.load(std::memory_order_relaxed))
    {
        int ret;
        while((ret=avcodec_receive_frame(mCodecCtx.get(), mDecodedFrame.get())) == AVERROR(EAGAIN))
            mPackets.sendTo(mCodecCtx.get());
        if(ret != 0)
        {
            if(ret == AVErrorEOF) break;
            std::cerr<< "Failed to receive frame: "<<ret <<std::endl;
            continue;
        }

        if(mDecodedFrame->nb_samples <= 0)
            continue;

        /* If provided, update w/ pts */
        if(mDecodedFrame->best_effort_timestamp != AVNoPtsValue)
            mCurrentPts = duration_cast<nanoseconds>(seconds_d64{av_q2d(mStream->time_base) *
                static_cast<double>(mDecodedFrame->best_effort_timestamp)});

        if(mDecodedFrame->nb_samples > mSamplesMax)
        {
            av_freep(&mSamples);
            av_samples_alloc(&mSamples, nullptr, mCodecCtx->channels, mDecodedFrame->nb_samples,
                mDstSampleFmt, 0);
            mSamplesMax = mDecodedFrame->nb_samples;
        }
        /* Return the amount of sample frames converted */
        int data_size{swr_convert(mSwresCtx.get(), &mSamples, mDecodedFrame->nb_samples,
            const_cast<const uint8_t**>(mDecodedFrame->data), mDecodedFrame->nb_samples)};

        av_frame_unref(mDecodedFrame.get());
        return data_size;
    }

    return 0;
}